

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanUpdater_impl.hpp
# Opt level: O0

void __thiscall
hiberlite::RowScope::addAssignment<std::__cxx11::string>
          (RowScope *this,string *name,
          db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *atom)

{
  size_type sVar1;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *this_00
  ;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a8;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_a0;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *x;
  Transformer local_88 [32];
  string local_68 [32];
  string local_48 [36];
  int local_24;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pdStack_20;
  int id;
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *atom_local;
  string *name_local;
  RowScope *this_local;
  
  pdStack_20 = atom;
  atom_local = (db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)name;
  name_local = (string *)this;
  sVar1 = std::vector<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>::size
                    (&this->atoms);
  local_24 = (int)sVar1 + 100;
  std::__cxx11::string::string(local_48,(string *)name);
  Transformer::toSQLiteValue_abi_cxx11_(local_88,&local_24);
  std::operator+((char *)local_68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"?");
  addSimpleAssign(this,(string *)local_48,local_68);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string(local_48);
  this_00 = (db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)operator_new(0x10);
  db_atom<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::db_atom
            (this_00,pdStack_20);
  local_a8 = this_00;
  local_a0 = this_00;
  std::vector<hiberlite::abstract_atom_*,_std::allocator<hiberlite::abstract_atom_*>_>::push_back
            (&this->atoms,(value_type *)&local_a8);
  return;
}

Assistant:

inline void RowScope::addAssignment(const std::string name, db_atom<C>& atom){
	int id=FirstAtom+static_cast<int>(atoms.size());

	addSimpleAssign(name, "?"+Transformer::toSQLiteValue(id) );

	db_atom<C>* x=new db_atom<C>(atom);
	atoms.push_back(x);
}